

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HestonVariancePathSimulator.cpp
# Opt level: O1

HestonVariancePathSimulator * __thiscall
HestonVariancePathSimulator::operator=
          (HestonVariancePathSimulator *this,HestonVariancePathSimulator *variancePathSimulator)

{
  HestonModel *this_00;
  
  if (this != variancePathSimulator) {
    if (this->hestonModel_ != (HestonModel *)0x0) {
      operator_delete(this->hestonModel_);
    }
    this_00 = (HestonModel *)operator_new(0x40);
    HestonModel::HestonModel(this_00,variancePathSimulator->hestonModel_);
    this->hestonModel_ = this_00;
    (this->super_PathSimulator).initialValue_ =
         (variancePathSimulator->super_PathSimulator).initialValue_;
    std::vector<double,_std::allocator<double>_>::operator=
              (&(this->super_PathSimulator).timePoints_,
               &(variancePathSimulator->super_PathSimulator).timePoints_);
  }
  return this;
}

Assistant:

HestonVariancePathSimulator& HestonVariancePathSimulator::operator=(
                        const HestonVariancePathSimulator& variancePathSimulator)
{
    if (this == &variancePathSimulator)
		return *this;
	else
	{
		delete hestonModel_;												
		hestonModel_ = new HestonModel(*(variancePathSimulator.hestonModel_));

        initialValue_ = variancePathSimulator.initialValue_;
        timePoints_ = variancePathSimulator.timePoints_;
	}
	return *this;
}